

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O3

int cargo_set_group_context(cargo_t ctx,char *group,void *user)

{
  int iVar1;
  
  if (group == (char *)0x0) {
    group = "";
  }
  iVar1 = _cargo_set_group_context(ctx,group,ctx->groups,ctx->group_count,user);
  return iVar1;
}

Assistant:

static int _cargo_set_group_context(cargo_t ctx,
        const char *group, cargo_group_t *groups, size_t group_count, void *user)
{
    cargo_group_t *grp = NULL;
    assert(ctx);

    // If a NULL group is given, we interpret that as the default "" group.
    if (!group)
    {
        group = "";
    }

    grp = _cargo_find_group(ctx, groups, group_count, group, NULL);

    if (!grp)
    {
        CARGODBG(1, "No such group \"%s\"\n", group);
        return -1;
    }

    grp->user = user;

    return 0;
}